

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlDocPtr xmlTextReaderCurrentDoc(xmlTextReaderPtr reader)

{
  xmlDocPtr pxVar1;
  
  if (reader != (xmlTextReaderPtr)0x0) {
    if (reader->doc != (xmlDocPtr)0x0) {
      return reader->doc;
    }
    if ((reader->ctxt != (xmlParserCtxtPtr)0x0) &&
       (pxVar1 = reader->ctxt->myDoc, pxVar1 != (xmlDocPtr)0x0)) {
      reader->preserve = 1;
      return pxVar1;
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlTextReaderCurrentDoc(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(NULL);
    if (reader->doc != NULL)
        return(reader->doc);
    if ((reader->ctxt == NULL) || (reader->ctxt->myDoc == NULL))
	return(NULL);

    reader->preserve = 1;
    return(reader->ctxt->myDoc);
}